

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePaddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  PaddingTypeCase PVar4;
  BorderAmounts *pBVar5;
  string *psVar6;
  Result local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  string err_1;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string err;
  PaddingLayerParams *params;
  string local_128;
  Result local_108;
  allocator local_d9;
  string local_d8;
  Result local_b8;
  undefined4 local_8c;
  Result local_88;
  Result local_50;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,1,1);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good(__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    local_21 = 1;
    local_8c = 1;
    goto LAB_00a21878;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"Padding",&local_d9);
    validateInputOutputRankEquality(&local_b8,pNVar1,&local_d8,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_b8);
    Result::~Result(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    bVar2 = Result::good(__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      local_21 = 1;
      local_8c = 1;
      goto LAB_00a21878;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"Padding",(allocator *)((long)&params + 7));
    validateRankCount(&local_108,pNVar1,&local_128,2,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_108);
    Result::~Result(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_21 = 1;
      local_8c = 1;
      goto LAB_00a21878;
    }
  }
  err.field_2._8_8_ = Specification::NeuralNetworkLayer::padding(local_20);
  pBVar5 = Specification::PaddingLayerParams::paddingamounts
                     ((PaddingLayerParams *)err.field_2._8_8_);
  iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar5);
  if (iVar3 != 0) {
    pBVar5 = Specification::PaddingLayerParams::paddingamounts
                       ((PaddingLayerParams *)err.field_2._8_8_);
    iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar5);
    if (iVar3 != 2) {
      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::operator+(&local_1b8,"Padding layer ",psVar6);
      std::operator+(&local_198,&local_1b8," specifies ");
      pBVar5 = Specification::PaddingLayerParams::paddingamounts
                         ((PaddingLayerParams *)err.field_2._8_8_);
      iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar5);
      std::__cxx11::to_string(&local_1d8,iVar3);
      std::operator+(&local_178,&local_198,&local_1d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     &local_178,
                     " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values."
                    );
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      Result::Result((Result *)((long)&err_1.field_2 + 8),INVALID_MODEL_PARAMETERS,
                     (string *)local_158);
      Result::operator=(__return_storage_ptr__,(Result *)((long)&err_1.field_2 + 8));
      Result::~Result((Result *)((long)&err_1.field_2 + 8));
      local_21 = 1;
      local_8c = 1;
      std::__cxx11::string::~string((string *)local_158);
      goto LAB_00a21878;
    }
  }
  PVar4 = Specification::PaddingLayerParams::PaddingType_case
                    ((PaddingLayerParams *)err.field_2._8_8_);
  if (PVar4 == PADDINGTYPE_NOT_SET) {
    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+(&local_240,"Padding layer ",psVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                   &local_240," padding type is not set.");
    std::__cxx11::string::~string((string *)&local_240);
    Result::Result(&local_268,INVALID_MODEL_PARAMETERS,(string *)local_220);
    Result::operator=(__return_storage_ptr__,&local_268);
    Result::~Result(&local_268);
    local_21 = 1;
    local_8c = 1;
    std::__cxx11::string::~string((string *)local_220);
  }
  else {
    local_21 = 1;
    local_8c = 1;
  }
LAB_00a21878:
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePaddingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Padding", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Padding", 2, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.padding();
    if (!(params.paddingamounts().borderamounts_size() == 0
          || params.paddingamounts().borderamounts_size() == 2)) {
        std::string err = "Padding layer " + layer.name() + " specifies " + std::to_string(params.paddingamounts().borderamounts_size()) + " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (params.PaddingType_case() == Specification::PaddingLayerParams::PaddingTypeCase::PADDINGTYPE_NOT_SET) {
        std::string err = "Padding layer " + layer.name() + " padding type is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}